

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void fieldsel(LexState *ls,expdesc *v)

{
  FuncState *fs;
  expdesc key;
  expdesc eStack_58;
  
  fs = ls->fs;
  eStack_58.usertype = (TString *)0x0;
  eStack_58.k = VVOID;
  eStack_58._4_4_ = 0;
  eStack_58.u.ival = 0;
  eStack_58.u.ind.usertype = (TString *)0x0;
  eStack_58.t = 0;
  eStack_58.f = 0;
  eStack_58.ravi_type_map = 0xffffffff;
  eStack_58._36_4_ = 0;
  eStack_58.pc = -1;
  eStack_58._52_4_ = 0;
  luaK_exp2anyregup(fs,v);
  luaX_next(ls);
  checkname(ls,&eStack_58);
  luaK_indexed(fs,v,&eStack_58);
  return;
}

Assistant:

static void fieldsel (LexState *ls, expdesc *v) {
  /* fieldsel -> ['.' | ':'] NAME */
  FuncState *fs = ls->fs;
  expdesc key = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  luaK_exp2anyregup(fs, v);
  luaX_next(ls);  /* skip the dot or colon */
  checkname(ls, &key);
  luaK_indexed(fs, v, &key);
}